

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeViewPrivate::drawAnimatedOperation(QTreeViewPrivate *this,QPainter *painter)

{
  QPixmap *pQVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  QPixmap *pQVar7;
  QPixmap *pQVar8;
  long in_FS_OFFSET;
  QRectF local_98;
  undefined8 local_78;
  double local_70;
  double local_68;
  double local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVariantAnimation::startValue();
  iVar2 = ::QVariant::toInt((bool *)local_58.data);
  ::QVariant::~QVariant((QVariant *)&local_58);
  QVariantAnimation::endValue();
  iVar3 = ::QVariant::toInt((bool *)local_58.data);
  ::QVariant::~QVariant((QVariant *)&local_58);
  QVariantAnimation::currentValue();
  uVar4 = ::QVariant::toInt((bool *)local_58.data);
  ::QVariant::~QVariant((QVariant *)&local_58);
  iVar5 = QAbstractAnimation::direction();
  pQVar1 = &(this->animatedOperation).before;
  pQVar8 = &(this->animatedOperation).after;
  local_98.w = (qreal)&DAT_aaaaaaaaaaaaaaaa;
  local_98.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
  local_98.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
  pQVar7 = pQVar8;
  if (iVar5 == 1) {
    pQVar7 = pQVar1;
  }
  if (iVar5 != 1) {
    pQVar8 = pQVar1;
  }
  QPixmap::QPixmap((QPixmap *)&local_98,pQVar7);
  iVar5 = QPixmap::width();
  iVar6 = QPixmap::height();
  local_58._8_8_ = (undefined8)iVar2;
  local_58.shared = (PrivateShared *)0x0;
  local_70 = (double)(int)(~uVar4 + iVar3);
  local_68 = (double)iVar5;
  local_58._16_8_ = 0xbff0000000000000;
  uStack_40 = 0xbff0000000000000;
  local_60 = (double)iVar6;
  local_78 = 0;
  QPainter::drawPixmap((QRectF *)painter,(QPixmap *)local_58.data,&local_98);
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::QPixmap((QPixmap *)local_58.data,pQVar8);
  local_70 = (double)(int)uVar4;
  local_78 = 0;
  QPainter::drawPixmap((QPointF *)painter,(QPixmap *)&local_78);
  QPixmap::~QPixmap((QPixmap *)local_58.data);
  QPixmap::~QPixmap((QPixmap *)&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeViewPrivate::drawAnimatedOperation(QPainter *painter) const
{
    const int start = animatedOperation.startValue().toInt(),
        end = animatedOperation.endValue().toInt(),
        current = animatedOperation.currentValue().toInt();
    bool collapsing = animatedOperation.direction() == QVariantAnimation::Backward;
    const QPixmap top = collapsing ? animatedOperation.before : animatedOperation.after;
    painter->drawPixmap(0, start, top, 0, end - current - 1, top.width(), top.height());
    const QPixmap bottom = collapsing ? animatedOperation.after : animatedOperation.before;
    painter->drawPixmap(0, current, bottom);
}